

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O1

Component __thiscall
ftxui::Checkbox(ftxui *this,ConstStringRef *label,bool *checked,Ref<ftxui::CheckboxOption> *option)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Component CVar5;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  string *local_e0;
  undefined1 local_d8 [88];
  _Invoker_type p_Stack_80;
  _Any_data local_78;
  undefined1 local_68 [8];
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  undefined1 local_48 [8];
  _Invoker_type p_Stack_40;
  CheckboxOption *local_38;
  
  puVar3 = (undefined8 *)operator_new(0x120);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00174e78;
  pcVar2 = (label->owned_)._M_dataplus._M_p;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar2,pcVar2 + (label->owned_)._M_string_length);
  local_e0 = label->address_;
  CheckboxOption::CheckboxOption((CheckboxOption *)local_d8,&option->owned_);
  local_38 = option->address_;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[2] = &PTR__CheckboxBase_00174ec8;
  puVar3[7] = puVar3 + 9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar3 + 7),local_100,local_f8 + (long)local_100);
  puVar3[0xb] = local_e0;
  puVar3[0xc] = checked;
  puVar3[0xd] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = puVar3 + 0x11;
  pcVar2 = local_d8 + 0x10;
  if ((pointer)local_d8._0_8_ == pcVar2) {
    puVar3[0x11] = CONCAT71(local_d8._17_7_,local_d8[0x10]);
    puVar3[0x12] = local_d8._24_8_;
  }
  else {
    puVar3[0xf] = local_d8._0_8_;
    puVar3[0x11] = CONCAT71(local_d8._17_7_,local_d8[0x10]);
  }
  pcVar1 = local_d8 + 0x30;
  puVar3[0x10] = local_d8._8_8_;
  local_d8._8_8_ = 0;
  local_d8[0x10] = '\0';
  puVar3[0x13] = puVar3 + 0x15;
  if ((pointer)local_d8._32_8_ == pcVar1) {
    puVar3[0x15] = CONCAT71(local_d8._49_7_,local_d8[0x30]);
    puVar3[0x16] = local_d8._56_8_;
  }
  else {
    puVar3[0x13] = local_d8._32_8_;
    puVar3[0x15] = CONCAT71(local_d8._49_7_,local_d8[0x30]);
  }
  puVar3[0x14] = local_d8._40_8_;
  local_d8._40_8_ = 0;
  local_d8[0x30] = '\0';
  puVar3[0x19] = 0;
  puVar3[0x17] = 0;
  puVar3[0x18] = 0;
  puVar3[0x1a] = p_Stack_80;
  _Var4._M_pi = extraout_RDX;
  if ((_Manager_type)local_d8._80_8_ != (_Manager_type)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x50);
    puVar3[0x17] = local_d8._64_8_;
    puVar3[0x18] = local_d8._72_8_;
    puVar3[0x19] = local_d8._80_8_;
    local_d8._80_8_ = (_Manager_type)0x0;
    p_Stack_80 = (_Invoker_type)0x0;
  }
  puVar3[0x1b] = 0;
  puVar3[0x1c] = 0;
  puVar3[0x1d] = 0;
  puVar3[0x1e] = p_Stack_60;
  if (local_68 != (undefined1  [8])0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68;
    puVar3[0x1b] = local_78._M_unused._M_object;
    puVar3[0x1c] = local_78._8_8_;
    puVar3[0x1d] = local_68;
    local_68 = (undefined1  [8])0x0;
    p_Stack_60 = (_Invoker_type)0x0;
  }
  puVar3[0x1f] = 0;
  puVar3[0x20] = 0;
  puVar3[0x21] = 0;
  puVar3[0x22] = p_Stack_40;
  if (local_48 != (undefined1  [8])0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
    puVar3[0x1f] = local_58._M_unused._M_object;
    puVar3[0x20] = local_58._8_8_;
    puVar3[0x21] = local_48;
    local_48 = (undefined1  [8])0x0;
    p_Stack_40 = (_Invoker_type)0x0;
  }
  puVar3[0x23] = local_38;
  local_d8._0_8_ = pcVar2;
  local_d8._32_8_ = pcVar1;
  if (local_48 != (undefined1  [8])0x0) {
    (*(code *)local_48)(&local_58,&local_58,3);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_68 != (undefined1  [8])0x0) {
    (*(code *)local_68)(&local_78,&local_78,3);
    _Var4._M_pi = extraout_RDX_01;
  }
  if ((_Manager_type)local_d8._80_8_ != (_Manager_type)0x0) {
    (*(code *)local_d8._80_8_)
              ((_Any_data *)(local_d8 + 0x40),(_Any_data *)(local_d8 + 0x40),__destroy_functor);
    _Var4._M_pi = extraout_RDX_02;
  }
  if ((pointer)local_d8._32_8_ != pcVar1) {
    operator_delete((void *)local_d8._32_8_,CONCAT71(local_d8._49_7_,local_d8[0x30]) + 1);
    _Var4._M_pi = extraout_RDX_03;
  }
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    _Var4._M_pi = extraout_RDX_04;
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
    _Var4._M_pi = extraout_RDX_05;
  }
  *(undefined8 **)this = puVar3 + 2;
  *(undefined8 **)(this + 8) = puVar3;
  CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar5.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Checkbox(ConstStringRef label,
                   bool* checked,
                   Ref<CheckboxOption> option) {
  return Make<CheckboxBase>(label, checked, std::move(option));
}